

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

CTcCodeLabel * __thiscall CTcCodeStream::new_label_fwd(CTcCodeStream *this)

{
  CTcCodeLabel *pCVar1;
  CTcCodeStream *unaff_retaddr;
  CTcCodeLabel *lbl;
  
  pCVar1 = alloc_label(unaff_retaddr);
  pCVar1->ofs = 0;
  pCVar1->field_0x18 = pCVar1->field_0x18 & 0xfe;
  return pCVar1;
}

Assistant:

CTcCodeLabel *CTcCodeStream::new_label_fwd()
{
    CTcCodeLabel *lbl;

    /* allocate a new label */
    lbl = alloc_label();

    /* the label's location is not yet known */
    lbl->ofs = 0;
    lbl->is_known = FALSE;

    /* return the new label */
    return lbl;
}